

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Plane *item)

{
  pointer pcVar1;
  ostream *poVar2;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"plane name: ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(item->name)._M_dataplus._M_p,(item->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\ncategory: ",0xb);
  pcVar1 = PLANE_CATE_NAME_abi_cxx11_[item->category]._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + PLANE_CATE_NAME_abi_cxx11_[item->category]._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nairSupremacy: ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,item->airSupremacy);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\ntorpedoAttack: ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,item->torpedoAtk);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nbombAttack: ",0xd);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,item->bombAtk);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\naccuracy",9);
  std::ostream::operator<<((ostream *)poVar2,item->accuracy);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os,Plane &item){
    os<<"plane name: "<<item.name<<"\ncategory: "<<PLANE_CATE_convert(item.category)<<"\nairSupremacy: "<<item.airSupremacy<<"\ntorpedoAttack: "<<item.torpedoAtk<<"\nbombAttack: "<<item.bombAtk<<"\naccuracy"<<item.accuracy;
    return os;
}